

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O2

void * v2i_NAME_CONSTRAINTS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s1;
  int iVar1;
  NAME_CONSTRAINTS *a;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  GENERAL_SUBTREE *a_00;
  GENERAL_NAME *pGVar5;
  OPENSSL_STACK *sk;
  NAME_CONSTRAINTS *pNVar6;
  ulong i;
  CONF_VALUE tval;
  
  a = NAME_CONSTRAINTS_new();
  if (a == (NAME_CONSTRAINTS *)0x0) {
    a_00 = (GENERAL_SUBTREE *)0x0;
LAB_002d7f58:
    NAME_CONSTRAINTS_free(a);
    GENERAL_SUBTREE_free(a_00);
    a = (NAME_CONSTRAINTS *)0x0;
  }
  else {
    for (i = 0; sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval), i < sVar2; i = i + 1) {
      pvVar3 = OPENSSL_sk_value((OPENSSL_STACK *)nval,i);
      __s1 = *(char **)((long)pvVar3 + 8);
      iVar1 = strncmp(__s1,"permitted",9);
      if (((iVar1 != 0) || (lVar4 = 10, pNVar6 = a, __s1[9] == '\0')) &&
         ((iVar1 = strncmp(__s1,"excluded",8), iVar1 != 0 ||
          (lVar4 = 9, pNVar6 = (NAME_CONSTRAINTS *)&a->excludedSubtrees, __s1[8] == '\0')))) {
        a_00 = (GENERAL_SUBTREE *)0x0;
        ERR_put_error(0x14,0,0x87,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_ncons.cc"
                      ,0x65);
        goto LAB_002d7f58;
      }
      tval.name = __s1 + lVar4;
      tval.value = *(char **)((long)pvVar3 + 0x10);
      a_00 = GENERAL_SUBTREE_new();
      pGVar5 = v2i_GENERAL_NAME_ex(a_00->base,(X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,
                                   (CONF_VALUE *)&tval,1);
      if (pGVar5 == (GENERAL_NAME *)0x0) goto LAB_002d7f58;
      sk = (OPENSSL_STACK *)pNVar6->permittedSubtrees;
      if (sk == (OPENSSL_STACK *)0x0) {
        sk = OPENSSL_sk_new_null();
        pNVar6->permittedSubtrees = (stack_st_GENERAL_SUBTREE *)sk;
        if (sk == (OPENSSL_STACK *)0x0) goto LAB_002d7f58;
      }
      sVar2 = OPENSSL_sk_push(sk,a_00);
      if (sVar2 == 0) goto LAB_002d7f58;
    }
  }
  return a;
}

Assistant:

static void *v2i_NAME_CONSTRAINTS(const X509V3_EXT_METHOD *method,
                                  const X509V3_CTX *ctx,
                                  const STACK_OF(CONF_VALUE) *nval) {
  STACK_OF(GENERAL_SUBTREE) **ptree = NULL;
  NAME_CONSTRAINTS *ncons = NULL;
  GENERAL_SUBTREE *sub = NULL;
  ncons = NAME_CONSTRAINTS_new();
  if (!ncons) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    CONF_VALUE tval;
    if (!strncmp(val->name, "permitted", 9) && val->name[9]) {
      ptree = &ncons->permittedSubtrees;
      tval.name = val->name + 10;
    } else if (!strncmp(val->name, "excluded", 8) && val->name[8]) {
      ptree = &ncons->excludedSubtrees;
      tval.name = val->name + 9;
    } else {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_SYNTAX);
      goto err;
    }
    tval.value = val->value;
    sub = GENERAL_SUBTREE_new();
    if (!v2i_GENERAL_NAME_ex(sub->base, method, ctx, &tval, 1)) {
      goto err;
    }
    if (!*ptree) {
      *ptree = sk_GENERAL_SUBTREE_new_null();
    }
    if (!*ptree || !sk_GENERAL_SUBTREE_push(*ptree, sub)) {
      goto err;
    }
    sub = NULL;
  }

  return ncons;

err:
  NAME_CONSTRAINTS_free(ncons);
  GENERAL_SUBTREE_free(sub);
  return NULL;
}